

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini_processing.cpp
# Opt level: O3

void __thiscall IniProcessing::IniProcessing(IniProcessing *this,IniProcessing *ip)

{
  pointer pcVar1;
  size_t sVar2;
  bool bVar3;
  undefined3 uVar4;
  int iVar5;
  undefined4 uVar6;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_true>_>_>
  local_28;
  
  (this->m_params).filePath._M_dataplus._M_p = (pointer)&(this->m_params).filePath.field_2;
  pcVar1 = (ip->m_params).filePath._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (ip->m_params).filePath._M_string_length);
  bVar3 = (ip->m_params).opened;
  uVar4 = *(undefined3 *)&(ip->m_params).field_0x21;
  iVar5 = (ip->m_params).lineWithError;
  *(undefined8 *)((long)&(this->m_params).lineWithError + 1) =
       *(undefined8 *)((long)&(ip->m_params).lineWithError + 1);
  (this->m_params).opened = bVar3;
  *(undefined3 *)&(this->m_params).field_0x21 = uVar4;
  (this->m_params).lineWithError = iVar5;
  local_28._M_h = (__hashtable_alloc *)&(this->m_params).iniData;
  (this->m_params).iniData._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->m_params).iniData._M_h._M_bucket_count = (ip->m_params).iniData._M_h._M_bucket_count;
  (this->m_params).iniData._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_params).iniData._M_h._M_element_count = (ip->m_params).iniData._M_h._M_element_count;
  uVar6 = *(undefined4 *)&(ip->m_params).iniData._M_h._M_rehash_policy.field_0x4;
  sVar2 = (ip->m_params).iniData._M_h._M_rehash_policy._M_next_resize;
  (this->m_params).iniData._M_h._M_rehash_policy._M_max_load_factor =
       (ip->m_params).iniData._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->m_params).iniData._M_h._M_rehash_policy.field_0x4 = uVar6;
  (this->m_params).iniData._M_h._M_rehash_policy._M_next_resize = sVar2;
  (this->m_params).iniData._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>,std::allocator<std::pair<std::__cxx11::string_const,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_28._M_h,&(ip->m_params).iniData._M_h,&local_28);
  (this->m_params).currentGroup = (ip->m_params).currentGroup;
  (this->m_params).currentGroupName._M_dataplus._M_p =
       (pointer)&(this->m_params).currentGroupName.field_2;
  pcVar1 = (ip->m_params).currentGroupName._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_params).currentGroupName,pcVar1,
             pcVar1 + (ip->m_params).currentGroupName._M_string_length);
  return;
}

Assistant:

IniProcessing::IniProcessing(const IniProcessing &ip) :
    m_params(ip.m_params)
{}